

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,REF_BOOL *improved)

{
  REF_DBL *pRVar1;
  REF_GRID ref_grid_00;
  REF_NODE pRVar2;
  REF_GEOM ref_geom_00;
  REF_CELL ref_cell_00;
  bool bVar3;
  uint uVar4;
  REF_STATUS RVar5;
  bool local_131;
  double local_130;
  REF_DBL local_128;
  double local_120;
  REF_DBL local_118;
  int local_110;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL skip;
  REF_INT seg_node;
  REF_INT seg;
  REF_DBL min_uv_area;
  REF_DBL uv_area;
  REF_DBL sign_uv_area;
  REF_DBL old_normdev;
  REF_DBL min_normdev;
  REF_DBL normdev;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT item;
  REF_INT node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_BOOL *improved_local;
  REF_CAVITY ref_cavity_local;
  
  ref_grid_00 = ref_cavity->ref_grid;
  pRVar2 = ref_grid_00->node;
  ref_geom_00 = ref_grid_00->geom;
  ref_cell_00 = ref_grid_00->cell[3];
  if (ref_cavity->surf_node == -1) {
    local_110 = ref_cavity->node;
  }
  else {
    local_110 = ref_cavity->surf_node;
  }
  *improved = 1;
  old_normdev = 2.0;
  _seg_node = 1e+200;
  for (nodes[0x1a] = 0; nodes[0x1a] < ref_cavity->tri_list->n; nodes[0x1a] = nodes[0x1a] + 1) {
    nodes[0x19] = ref_cavity->tri_list->value[nodes[0x1a]];
    uVar4 = ref_cell_nodes(ref_cell_00,nodes[0x19],(REF_INT *)&normdev);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x995,"ref_cavity_normdev",(ulong)uVar4,"cell");
      return uVar4;
    }
    uVar4 = ref_geom_tri_norm_deviation(ref_grid_00,(REF_INT *)&normdev,&min_normdev);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x997,"ref_cavity_normdev",(ulong)uVar4,"old tri normdev");
      return uVar4;
    }
    if (min_normdev <= old_normdev) {
      local_118 = min_normdev;
    }
    else {
      local_118 = old_normdev;
    }
    old_normdev = local_118;
    if (ref_geom_00->meshlink == (void *)0x0) {
      uVar4 = ref_geom_uv_area(ref_geom_00,(REF_INT *)&normdev,&min_uv_area);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x99a,"ref_cavity_normdev",(ulong)uVar4,"uv area");
        return uVar4;
      }
      uVar4 = ref_geom_uv_area_sign(ref_grid_00,nodes[1],&uv_area);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x99b,"ref_cavity_normdev",(ulong)uVar4,"sign");
        return uVar4;
      }
      min_uv_area = uv_area * min_uv_area;
      local_120 = min_uv_area;
      if (_seg_node < min_uv_area) {
        local_120 = _seg_node;
      }
      _seg_node = local_120;
    }
  }
  sign_uv_area = old_normdev;
  if (ref_cavity->debug != 0) {
    printf("- min %12.8f %12.8f\n",old_normdev,_seg_node);
  }
  old_normdev = 2.0;
  _seg_node = 1e+200;
  skip = 0;
  do {
    if (ref_cavity->maxseg <= skip) {
      if (ref_cavity->debug != 0) {
        printf("+ min %12.8f %12.8f\n",old_normdev,_seg_node);
      }
      pRVar1 = &pRVar2->min_uv_area;
      local_131 = (*pRVar1 <= _seg_node && _seg_node != *pRVar1) && sign_uv_area < old_normdev;
      *improved = (uint)local_131;
      return 0;
    }
    if (((-1 < skip) && (skip < ref_cavity->maxseg)) && (ref_cavity->s2n[skip * 3] != -1)) {
      bVar3 = false;
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 2;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        if (local_110 == ref_cavity->s2n[ref_private_macro_code_rss + skip * 3]) {
          bVar3 = true;
        }
      }
      if (!bVar3) {
        for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 2;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          nodes[(long)ref_private_macro_code_rss + -2] =
               ref_cavity->s2n[ref_private_macro_code_rss + skip * 3];
        }
        nodes[0] = local_110;
        nodes[1] = ref_cavity->s2n[skip * 3 + 2];
        RVar5 = ref_geom_tri_norm_deviation(ref_grid_00,(REF_INT *)&normdev,&min_normdev);
        if (RVar5 != 0) {
          *improved = 0;
          return 0;
        }
        if (min_normdev <= old_normdev) {
          local_128 = min_normdev;
        }
        else {
          local_128 = old_normdev;
        }
        old_normdev = local_128;
        if (ref_geom_00->meshlink == (void *)0x0) {
          uVar4 = ref_geom_uv_area(ref_geom_00,(REF_INT *)&normdev,&min_uv_area);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x9bb,"ref_cavity_normdev",(ulong)uVar4,"uv area");
            return uVar4;
          }
          uVar4 = ref_geom_uv_area_sign(ref_grid_00,nodes[1],&uv_area);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x9bc,"ref_cavity_normdev",(ulong)uVar4,"sign");
            return uVar4;
          }
          min_uv_area = uv_area * min_uv_area;
          local_130 = min_uv_area;
          if (_seg_node < min_uv_area) {
            local_130 = _seg_node;
          }
          _seg_node = local_130;
        }
      }
    }
    skip = skip + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,
                                      REF_BOOL *improved) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev, min_normdev, old_normdev;
  REF_DBL sign_uv_area, uv_area, min_uv_area;
  REF_INT seg, seg_node;
  REF_BOOL skip;

  node = ref_cavity_seg_node(ref_cavity);

  *improved = REF_TRUE;

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev),
        "old tri normdev");
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  old_normdev = min_normdev;

  if (ref_cavity_debug(ref_cavity))
    printf("- min %12.8f %12.8f\n", min_normdev, min_uv_area);

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      if (node == ref_cavity_s2n(ref_cavity, seg_node, seg)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      nodes[seg_node] = ref_cavity_s2n(ref_cavity, seg_node, seg);
    }
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
      *improved = REF_FALSE;
      return REF_SUCCESS;
    }
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  if (ref_cavity_debug(ref_cavity))
    printf("+ min %12.8f %12.8f\n", min_normdev, min_uv_area);

  *improved = (min_uv_area > ref_node_min_uv_area(ref_node) &&
               min_normdev > old_normdev);

  return REF_SUCCESS;
}